

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

int Mio_LibGateSimulateOne(Mio_Gate_t *pGate,int *iBits)

{
  uint uVar1;
  ulong uVar2;
  word *pwVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar1 = Mio_GateReadPinNum(pGate);
  uVar4 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar4;
  }
  uVar1 = 0;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    uVar5 = 1 << ((byte)uVar4 & 0x1f);
    if (iBits[uVar4] == 0) {
      uVar5 = 0;
    }
    uVar1 = uVar1 | uVar5;
  }
  pwVar3 = Mio_GateReadTruthP(pGate);
  return (int)((*(uint *)((long)pwVar3 + (long)((int)uVar1 >> 5) * 4) >> (uVar1 & 0x1f) & 1) != 0);
}

Assistant:

int Mio_LibGateSimulateOne( Mio_Gate_t * pGate, int iBits[6] )
{
    int nVars = Mio_GateReadPinNum(pGate);
    int i, iMint = 0;
    for ( i = 0; i < nVars; i++ )
        if ( iBits[i] )
            iMint |= (1 << i);
    return Abc_InfoHasBit( (unsigned *)Mio_GateReadTruthP(pGate), iMint );
}